

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall spvtools::opt::IRContext::BuildInstrToBlockMapping(IRContext *this)

{
  Module *pMVar1;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var2;
  long *plVar3;
  long lVar4;
  char cVar5;
  Instruction *pIVar6;
  long *plVar7;
  Instruction *pIVar8;
  Instruction *local_90;
  _Any_data *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  pointer local_40;
  pointer local_38;
  
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->instr_to_block_)._M_h);
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_38 = *(pointer *)
              &(pMVar1->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
               ._M_impl;
  local_40 = (pMVar1->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_38 != local_40) {
    do {
      _Var2.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           (local_38->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      plVar3 = *(long **)((long)_Var2.
                                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                _M_head_impl + 0xa0);
      for (plVar7 = *(long **)((long)_Var2.
                                     super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                     .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                     _M_head_impl + 0x98); plVar7 != plVar3; plVar7 = plVar7 + 1) {
        lVar4 = *plVar7;
        pcStack_50 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h:705:27)>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h:705:27)>
                   ::_M_manager;
        uStack_80 = 0;
        local_88 = &local_68;
        pcStack_70 = std::
                     _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                   ::_M_manager;
        local_68._M_unused._M_object = this;
        local_68._8_8_ = lVar4;
        if (*(Instruction **)(lVar4 + 8) != (Instruction *)0x0) {
          local_90 = *(Instruction **)(lVar4 + 8);
          std::
          _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h:705:27)>
          ::_M_invoke(local_88,&local_90);
        }
        pIVar6 = *(Instruction **)(lVar4 + 0x20);
        if ((pIVar6 != (Instruction *)0x0) &&
           ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
          do {
            if (pIVar6 == (Instruction *)0x0) break;
            pIVar8 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            local_90 = pIVar6;
            if (local_78 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            if ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
            {
              pIVar8 = (Instruction *)0x0;
            }
            cVar5 = (*pcStack_70)(&local_88,&local_90);
            pIVar6 = pIVar8;
          } while (cVar5 != '\0');
        }
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,3);
        }
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
      }
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisInstrToBlockMapping
  ;
  return;
}

Assistant:

void BuildInstrToBlockMapping() {
    instr_to_block_.clear();
    for (auto& fn : *module_) {
      for (auto& block : fn) {
        block.ForEachInst([this, &block](Instruction* inst) {
          instr_to_block_[inst] = &block;
        });
      }
    }
    valid_analyses_ = valid_analyses_ | kAnalysisInstrToBlockMapping;
  }